

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer pBVar5;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  pointer pMVar9;
  long *plVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Layer *pLVar14;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int iVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  int bottom_blob_index;
  int local_138;
  int local_134;
  long local_130;
  Layer *local_128;
  long local_120;
  uint local_114;
  int local_110;
  int local_10c;
  vector<int,_std::allocator<int>_> *local_108;
  int local_fc;
  Net *local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  ParamDict local_e8;
  Mat local_d8;
  Mat local_88;
  DataReader *local_38;
  
  local_fc = 0;
  iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_fc,4);
  if (CONCAT44(extraout_var,iVar13) == 4) {
    if (local_fc == 0x7685dd) {
      local_10c = 0;
      local_110 = 0;
      iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_10c,4);
      if (CONCAT44(extraout_var_00,iVar13) == 4) {
        iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_110,4);
        if (CONCAT44(extraout_var_01,iVar13) == 4) {
          if ((0 < (long)local_10c) && (0 < local_110)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_10c);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_110);
            ParamDict::ParamDict(&local_e8);
            bVar11 = 0 < local_10c;
            if (0 < local_10c) {
              local_120 = 0;
              local_f8 = this;
              local_38 = dr;
              do {
                iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_114,4);
                if (CONCAT44(extraout_var_02,iVar13) == 4) {
                  iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_134,4);
                  if (CONCAT44(extraout_var_03,iVar13) != 4) {
                    load_param_bin();
                    goto LAB_0018fc0e;
                  }
                  iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_138,4);
                  if (CONCAT44(extraout_var_04,iVar13) != 4) {
                    load_param_bin();
                    goto LAB_0018fc0e;
                  }
                  pLVar14 = create_layer(local_114);
                  if (pLVar14 == (Layer *)0x0) {
                    iVar13 = (*this->_vptr_Net[4])(this,(ulong)(local_114 & 0xfffffeff));
                    pLVar14 = (Layer *)CONCAT44(extraout_var_05,iVar13);
                  }
                  if (pLVar14 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered",(ulong)local_114);
                    fputc(10,_stderr);
                    iVar13 = 1;
                    clear(this);
                  }
                  else {
                    local_f0 = &pLVar14->bottoms;
                    std::vector<int,_std::allocator<int>_>::resize(local_f0,(long)local_134);
                    bVar12 = 0 < local_134;
                    iVar13 = 0x17;
                    local_128 = pLVar14;
                    if (0 < local_134) {
                      lVar17 = 0;
                      do {
                        iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_d8,4);
                        if (CONCAT44(extraout_var_06,iVar13) != 4) {
                          load_param_bin();
                          iVar13 = 1;
                          goto LAB_0018faa4;
                        }
                        (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_d8.data].consumer =
                             (int)local_120;
                        (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar17] = (int)local_d8.data;
                        lVar17 = lVar17 + 1;
                        bVar12 = lVar17 < local_134;
                      } while (lVar17 < local_134);
                      iVar13 = 0x17;
                    }
LAB_0018faa4:
                    pLVar14 = local_128;
                    if (!bVar12) {
                      local_108 = &local_128->tops;
                      std::vector<int,_std::allocator<int>_>::resize(local_108,(long)local_138);
                      bVar12 = 0 < local_138;
                      iVar13 = 0x1c;
                      if (0 < local_138) {
                        lVar17 = 0;
                        do {
                          iVar13 = (*dr->_vptr_DataReader[3])(dr,&local_d8,4);
                          if (CONCAT44(extraout_var_07,iVar13) != 4) {
                            load_param_bin();
                            iVar13 = 1;
                            pLVar14 = local_128;
                            goto LAB_0018fb52;
                          }
                          (this->d->blobs).
                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                          super__Vector_impl_data._M_start[(int)local_d8.data].producer =
                               (int)local_120;
                          (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar17] = (int)local_d8.data;
                          lVar17 = lVar17 + 1;
                          bVar12 = lVar17 < local_138;
                        } while (lVar17 < local_138);
                        iVar13 = 0x1c;
                        pLVar14 = local_128;
                      }
LAB_0018fb52:
                      if (!bVar12) {
                        iVar13 = ParamDict::load_param_bin(&local_e8,dr);
                        if (iVar13 == 0) {
                          if (pLVar14->support_int8_storage == true) {
                            (this->opt).use_vulkan_compute = false;
                          }
                          local_88.cstep = 0;
                          local_88.data = (void *)0x0;
                          local_88.refcount._0_4_ = 0;
                          local_88.refcount._4_4_ = 0;
                          local_88.elemsize._0_4_ = 0;
                          local_88._20_8_ = 0;
                          local_88.h = 0;
                          local_88.d = 0;
                          local_88.c = 0;
                          local_88.allocator = (Allocator *)0x0;
                          local_88.dims = 0;
                          local_88.w = 0;
                          ParamDict::get(&local_d8,&local_e8,0x1e,&local_88);
                          piVar18 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_)
                          ;
                          if (piVar18 != (int *)0x0) {
                            LOCK();
                            *piVar18 = *piVar18 + -1;
                            UNLOCK();
                            if (*piVar18 == 0) {
                              if (local_88.allocator == (Allocator *)0x0) {
                                if (local_88.data != (void *)0x0) {
                                  free(local_88.data);
                                }
                              }
                              else {
                                (*(local_88.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_88.cstep = 0;
                          local_88.data = (void *)0x0;
                          local_88.refcount._0_4_ = 0;
                          local_88.refcount._4_4_ = 0;
                          local_88.elemsize._0_4_ = 0;
                          local_88._20_8_ = 0;
                          local_88.dims = 0;
                          local_88.w = 0;
                          local_88.h = 0;
                          local_88.d = 0;
                          local_88.c = 0;
                          if (((local_d8.data != (void *)0x0) &&
                              ((long)local_d8.c * local_d8.cstep != 0)) && (0 < local_138)) {
                            piVar18 = (int *)((long)local_d8.data + 0xc);
                            lVar17 = 0;
                            do {
                              iVar13 = (local_108->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar17];
                              pBVar5 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              iVar3 = piVar18[-3];
                              if (iVar3 == 3) {
LAB_0018fe3b:
                                iVar3 = piVar18[-2];
                                iVar4 = piVar18[-1];
                                iVar15 = *piVar18;
                                piVar6 = pBVar5[iVar13].shape.refcount;
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    pvVar7 = pBVar5[iVar13].shape.data;
                                    pAVar8 = pBVar5[iVar13].shape.allocator;
                                    if (pAVar8 == (Allocator *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        local_130 = CONCAT44(local_130._4_4_,iVar15);
                                        free(pvVar7);
                                        iVar15 = (int)local_130;
                                      }
                                    }
                                    else {
                                      local_130 = CONCAT44(local_130._4_4_,iVar15);
                                      (*pAVar8->_vptr_Allocator[3])();
                                      iVar15 = (int)local_130;
                                    }
                                  }
                                }
                                pBVar5[iVar13].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                                pBVar5[iVar13].shape.data = (void *)0x0;
                                pBVar5[iVar13].shape.refcount = (int *)0x0;
                                pBVar5[iVar13].shape.dims = 0;
                                pBVar5[iVar13].shape.w = 0;
                                pBVar5[iVar13].shape.h = 0;
                                pBVar5[iVar13].shape.d = 0;
                                pBVar5[iVar13].shape.elemsize = 4;
                                pBVar5[iVar13].shape.elempack = 1;
                                pBVar5[iVar13].shape.allocator = (Allocator *)0x0;
                                pBVar5[iVar13].shape.dims = 3;
                                pBVar5[iVar13].shape.w = iVar3;
                                pBVar5[iVar13].shape.h = iVar4;
                                pBVar5[iVar13].shape.d = 1;
                                pBVar5[iVar13].shape.c = iVar15;
                                pBVar5[iVar13].shape.cstep =
                                     (long)iVar4 * (long)iVar3 + 3U & 0x3ffffffffffffffc;
                              }
                              else if (iVar3 == 2) {
                                lVar16 = (long)piVar18[-2];
                                iVar4 = piVar18[-1];
                                piVar6 = pBVar5[iVar13].shape.refcount;
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    pvVar7 = pBVar5[iVar13].shape.data;
                                    pAVar8 = pBVar5[iVar13].shape.allocator;
                                    if (pAVar8 == (Allocator *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        local_130 = lVar16;
                                        free(pvVar7);
                                        lVar16 = local_130;
                                      }
                                    }
                                    else {
                                      local_130 = lVar16;
                                      (*pAVar8->_vptr_Allocator[3])();
                                      lVar16 = local_130;
                                    }
                                  }
                                }
                                pBVar5[iVar13].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                                pBVar5[iVar13].shape.data = (void *)0x0;
                                pBVar5[iVar13].shape.refcount = (int *)0x0;
                                pBVar5[iVar13].shape.dims = 0;
                                pBVar5[iVar13].shape.w = 0;
                                pBVar5[iVar13].shape.h = 0;
                                pBVar5[iVar13].shape.d = 0;
                                pBVar5[iVar13].shape.elemsize = 4;
                                pBVar5[iVar13].shape.elempack = 1;
                                pBVar5[iVar13].shape.allocator = (Allocator *)0x0;
                                pBVar5[iVar13].shape.dims = 2;
                                pBVar5[iVar13].shape.w = (int)lVar16;
                                pBVar5[iVar13].shape.h = iVar4;
                                pBVar5[iVar13].shape.d = 1;
                                pBVar5[iVar13].shape.c = 1;
                                pBVar5[iVar13].shape.cstep = iVar4 * lVar16;
LAB_0018fe32:
                                if (iVar3 == 3) goto LAB_0018fe3b;
                              }
                              else if (iVar3 == 1) {
                                iVar4 = piVar18[-2];
                                piVar6 = pBVar5[iVar13].shape.refcount;
                                if (piVar6 != (int *)0x0) {
                                  LOCK();
                                  *piVar6 = *piVar6 + -1;
                                  UNLOCK();
                                  if (*piVar6 == 0) {
                                    pvVar7 = pBVar5[iVar13].shape.data;
                                    pAVar8 = pBVar5[iVar13].shape.allocator;
                                    if (pAVar8 == (Allocator *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        free(pvVar7);
                                      }
                                    }
                                    else {
                                      (*pAVar8->_vptr_Allocator[3])();
                                    }
                                  }
                                }
                                pBVar5[iVar13].shape.cstep = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                                *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                                pBVar5[iVar13].shape.data = (void *)0x0;
                                pBVar5[iVar13].shape.refcount = (int *)0x0;
                                pBVar5[iVar13].shape.dims = 0;
                                pBVar5[iVar13].shape.w = 0;
                                pBVar5[iVar13].shape.h = 0;
                                pBVar5[iVar13].shape.d = 0;
                                pBVar5[iVar13].shape.elemsize = 4;
                                pBVar5[iVar13].shape.elempack = 1;
                                pBVar5[iVar13].shape.allocator = (Allocator *)0x0;
                                pBVar5[iVar13].shape.dims = 1;
                                pBVar5[iVar13].shape.w = iVar4;
                                pBVar5[iVar13].shape.h = 1;
                                pBVar5[iVar13].shape.d = 1;
                                pBVar5[iVar13].shape.c = 1;
                                pBVar5[iVar13].shape.cstep = (long)iVar4;
                                goto LAB_0018fe32;
                              }
                              lVar17 = lVar17 + 1;
                              piVar18 = piVar18 + 4;
                            } while (lVar17 < local_138);
                          }
                          pvVar1 = &local_128->bottom_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_134);
                          if (0 < local_134) {
                            lVar17 = 0;
                            lVar16 = 0;
                            do {
                              iVar13 = (local_f0->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar16];
                              pBVar5 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar9 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar9->data + lVar17);
                              if ((Mat *)puVar2 != &pBVar5[iVar13].shape) {
                                piVar18 = pBVar5[iVar13].shape.refcount;
                                if (piVar18 != (int *)0x0) {
                                  LOCK();
                                  *piVar18 = *piVar18 + 1;
                                  UNLOCK();
                                }
                                piVar18 = *(int **)((long)&pMVar9->refcount + lVar17);
                                if (piVar18 != (int *)0x0) {
                                  LOCK();
                                  *piVar18 = *piVar18 + -1;
                                  UNLOCK();
                                  if (*piVar18 == 0) {
                                    pvVar7 = *(void **)((long)&pMVar9->data + lVar17);
                                    plVar10 = *(long **)((long)&pMVar9->allocator + lVar17);
                                    if (plVar10 == (long *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        free(pvVar7);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar10 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar9->cstep + lVar17) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar17);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar9->c + lVar17) = 0;
                                piVar18 = pBVar5[iVar13].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar9->data + lVar17);
                                *puVar2 = pBVar5[iVar13].shape.data;
                                puVar2[1] = piVar18;
                                *(size_t *)((long)&pMVar9->elemsize + lVar17) =
                                     pBVar5[iVar13].shape.elemsize;
                                *(int *)((long)&pMVar9->elempack + lVar17) =
                                     pBVar5[iVar13].shape.elempack;
                                *(Allocator **)((long)&pMVar9->allocator + lVar17) =
                                     pBVar5[iVar13].shape.allocator;
                                iVar3 = pBVar5[iVar13].shape.w;
                                iVar4 = pBVar5[iVar13].shape.h;
                                iVar15 = pBVar5[iVar13].shape.d;
                                piVar18 = (int *)((long)&pMVar9->dims + lVar17);
                                *piVar18 = pBVar5[iVar13].shape.dims;
                                piVar18[1] = iVar3;
                                piVar18[2] = iVar4;
                                piVar18[3] = iVar15;
                                *(int *)((long)&pMVar9->c + lVar17) = pBVar5[iVar13].shape.c;
                                *(size_t *)((long)&pMVar9->cstep + lVar17) =
                                     pBVar5[iVar13].shape.cstep;
                              }
                              lVar16 = lVar16 + 1;
                              lVar17 = lVar17 + 0x48;
                              this = local_f8;
                            } while (lVar16 < local_134);
                          }
                          pvVar1 = &local_128->top_shapes;
                          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                                    (pvVar1,(long)local_138);
                          if (0 < local_138) {
                            lVar17 = 0;
                            lVar16 = 0;
                            do {
                              iVar13 = (local_108->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start[lVar16];
                              pBVar5 = (this->d->blobs).
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                              pMVar9 = (pvVar1->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
                              puVar2 = (undefined8 *)((long)&pMVar9->data + lVar17);
                              if ((Mat *)puVar2 != &pBVar5[iVar13].shape) {
                                piVar18 = pBVar5[iVar13].shape.refcount;
                                if (piVar18 != (int *)0x0) {
                                  LOCK();
                                  *piVar18 = *piVar18 + 1;
                                  UNLOCK();
                                }
                                piVar18 = *(int **)((long)&pMVar9->refcount + lVar17);
                                if (piVar18 != (int *)0x0) {
                                  LOCK();
                                  *piVar18 = *piVar18 + -1;
                                  UNLOCK();
                                  if (*piVar18 == 0) {
                                    pvVar7 = *(void **)((long)&pMVar9->data + lVar17);
                                    plVar10 = *(long **)((long)&pMVar9->allocator + lVar17);
                                    if (plVar10 == (long *)0x0) {
                                      if (pvVar7 != (void *)0x0) {
                                        free(pvVar7);
                                      }
                                    }
                                    else {
                                      (**(code **)(*plVar10 + 0x18))();
                                    }
                                  }
                                }
                                *(undefined8 *)((long)&pMVar9->cstep + lVar17) = 0;
                                *(undefined8 *)((long)puVar2 + 0xc) = 0;
                                *(undefined8 *)((long)puVar2 + 0x14) = 0;
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar17);
                                *puVar2 = 0;
                                puVar2[1] = 0;
                                *(undefined4 *)((long)&pMVar9->c + lVar17) = 0;
                                piVar18 = pBVar5[iVar13].shape.refcount;
                                puVar2 = (undefined8 *)((long)&pMVar9->data + lVar17);
                                *puVar2 = pBVar5[iVar13].shape.data;
                                puVar2[1] = piVar18;
                                *(size_t *)((long)&pMVar9->elemsize + lVar17) =
                                     pBVar5[iVar13].shape.elemsize;
                                *(int *)((long)&pMVar9->elempack + lVar17) =
                                     pBVar5[iVar13].shape.elempack;
                                *(Allocator **)((long)&pMVar9->allocator + lVar17) =
                                     pBVar5[iVar13].shape.allocator;
                                iVar3 = pBVar5[iVar13].shape.w;
                                iVar4 = pBVar5[iVar13].shape.h;
                                iVar15 = pBVar5[iVar13].shape.d;
                                piVar18 = (int *)((long)&pMVar9->dims + lVar17);
                                *piVar18 = pBVar5[iVar13].shape.dims;
                                piVar18[1] = iVar3;
                                piVar18[2] = iVar4;
                                piVar18[3] = iVar15;
                                *(int *)((long)&pMVar9->c + lVar17) = pBVar5[iVar13].shape.c;
                                *(size_t *)((long)&pMVar9->cstep + lVar17) =
                                     pBVar5[iVar13].shape.cstep;
                              }
                              lVar16 = lVar16 + 1;
                              lVar17 = lVar17 + 0x48;
                              this = local_f8;
                            } while (lVar16 < local_138);
                          }
                          pLVar14 = local_128;
                          iVar13 = (*local_128->_vptr_Layer[2])(local_128,&local_e8);
                          dr = local_38;
                          if (iVar13 == 0) {
                            (this->d->layers).
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_120] = pLVar14;
                            iVar13 = 0;
                          }
                          else {
                            load_param_bin();
                            iVar13 = 0xe;
                          }
                          piVar18 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_)
                          ;
                          if (piVar18 != (int *)0x0) {
                            LOCK();
                            *piVar18 = *piVar18 + -1;
                            UNLOCK();
                            if (*piVar18 == 0) {
                              if (local_d8.allocator == (Allocator *)0x0) {
                                if (local_d8.data != (void *)0x0) {
                                  free(local_d8.data);
                                }
                              }
                              else {
                                (*(local_d8.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_d8.cstep = 0;
                          local_d8.data = (void *)0x0;
                          local_d8.refcount._0_4_ = 0;
                          local_d8.refcount._4_4_ = 0;
                          local_d8.elemsize._0_4_ = 0;
                          local_d8._20_8_ = 0;
                          local_d8.dims = 0;
                          local_d8.w = 0;
                          local_d8.h = 0;
                          local_d8.d = 0;
                          local_d8.c = 0;
                        }
                        else {
                          load_param_bin();
                          iVar13 = 0xe;
                        }
                      }
                    }
                  }
                }
                else {
                  load_param_bin();
LAB_0018fc0e:
                  iVar13 = 1;
                }
                if ((iVar13 != 0xe) && (iVar13 != 0)) {
                  iVar13 = -1;
                  if (bVar11) goto LAB_0019023a;
                  break;
                }
                local_120 = local_120 + 1;
                bVar11 = local_120 < local_10c;
              } while (local_120 < local_10c);
            }
            iVar13 = 0;
            NetPrivate::update_input_output_indexes(this->d);
LAB_0019023a:
            ParamDict::~ParamDict(&local_e8);
            return iVar13;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("ParamDict load_param %d failed", i);
#endif
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_param %d failed", i);
#endif
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}